

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O0

void __thiscall QHexView::drawHeader(QHexView *this,QTextCursor *c)

{
  qsizetype qVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  QPalette *pQVar5;
  QColor *pQVar6;
  qreal qVar7;
  qreal qVar8;
  qreal qVar9;
  qreal qVar10;
  QBrush local_308 [8];
  QTextBlockFormat local_300 [8];
  QTextBlockFormat bf;
  QString local_2f0;
  QString local_2d8;
  QString local_2c0;
  QTextCharFormat local_2a8 [16];
  QString local_298;
  QBrush local_280 [8];
  QBrush local_278 [8];
  QString local_270;
  undefined1 local_258 [8];
  QString a;
  QTextCharFormat local_238 [4];
  uint i_1;
  QString local_228;
  QString local_210;
  undefined1 local_1f8 [8];
  QString asciilabel;
  QString local_1c8;
  QString local_1b0;
  QTextCharFormat local_198 [16];
  QString local_188;
  QBrush local_170 [8];
  QBrush local_168 [14];
  QChar local_15a;
  QString local_158;
  QString local_140;
  undefined1 local_128 [8];
  QString h;
  QTextCharFormat local_108 [4];
  uint i;
  QString local_f8;
  QString local_e0;
  undefined1 local_c8 [8];
  QString hexlabel;
  QString local_98;
  QString local_80;
  QTextCharFormat local_68 [8];
  QTextCharFormat cf;
  QString local_48;
  undefined1 local_30 [8];
  QString addresslabel;
  QTextCursor *c_local;
  QHexView *this_local;
  
  addresslabel.d.size = (qsizetype)c;
  bVar2 = QHexOptions::hasFlag(&this->m_options,0x20);
  if (!bVar2) {
    QString::QString((QString *)local_30);
    if (this->m_hexdelegate != (QHexDelegate *)0x0) {
      (**(code **)(*(long *)this->m_hexdelegate + 0x60))(&local_48);
      QString::operator=((QString *)local_30,&local_48);
      QString::~QString(&local_48);
    }
    bVar2 = QString::isEmpty((QString *)local_30);
    if ((bVar2) && (bVar2 = QString::isEmpty(&(this->m_options).addresslabel), !bVar2)) {
      QString::operator=((QString *)local_30,(QString *)&(this->m_options).addresslabel);
    }
    QTextCharFormat::QTextCharFormat(local_68);
    drawHeader::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&drawHeader(QTextCursor&)::RESET_FORMAT,&this->m_options,
               local_68);
    if (this->m_hexdelegate != (QHexDelegate *)0x0) {
      (**(code **)(*(long *)this->m_hexdelegate + 0x88))(this->m_hexdelegate,local_30,1,local_68);
    }
    qVar1 = addresslabel.d.size;
    uVar3 = addressWidth(this);
    reduced((QString *)&hexlabel.d.size,(QString *)local_30,uVar3);
    ::operator+(&local_98," ",(QString *)&hexlabel.d.size);
    ::operator+(&local_80,&local_98," ");
    QTextCursor::insertText((QString *)qVar1,(QTextCharFormat *)&local_80);
    QString::~QString(&local_80);
    QString::~QString(&local_98);
    QString::~QString((QString *)&hexlabel.d.size);
    if (this->m_hexdelegate != (QHexDelegate *)0x0) {
      drawHeader::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&drawHeader(QTextCursor&)::RESET_FORMAT,&this->m_options
                 ,local_68);
    }
    QString::QString((QString *)local_c8);
    if (this->m_hexdelegate != (QHexDelegate *)0x0) {
      (**(code **)(*(long *)this->m_hexdelegate + 0x68))(&local_e0);
      QString::operator=((QString *)local_c8,&local_e0);
      QString::~QString(&local_e0);
    }
    bVar2 = QString::isEmpty((QString *)local_c8);
    if (bVar2) {
      QString::operator=((QString *)local_c8,(QString *)&(this->m_options).hexlabel);
    }
    bVar2 = QString::isNull((QString *)local_c8);
    qVar1 = addresslabel.d.size;
    if (bVar2) {
      QString::QString(&local_f8," ");
      QTextCharFormat::QTextCharFormat(local_108);
      QTextCursor::insertText((QString *)qVar1,(QTextCharFormat *)&local_f8);
      QTextCharFormat::~QTextCharFormat(local_108);
      QString::~QString(&local_f8);
      for (h.d.size._4_4_ = 0; h.d.size._4_4_ < (this->m_options).linelength;
          h.d.size._4_4_ = (this->m_options).grouplength + h.d.size._4_4_) {
        QString::number((uint)&local_158,h.d.size._4_4_);
        uVar3 = (this->m_options).grouplength;
        QChar::QChar(&local_15a,'0');
        QString::rightJustified
                  ((longlong)&local_140,(QChar)(char16_t)&local_158,(bool)((char)uVar3 * '\x02'));
        QString::toUpper((QString *)local_128,&local_140);
        QString::~QString(&local_140);
        QString::~QString(&local_158);
        if (this->m_hexdelegate != (QHexDelegate *)0x0) {
          drawHeader::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&drawHeader(QTextCursor&)::RESET_FORMAT,
                     &this->m_options,local_68);
          (**(code **)(*(long *)this->m_hexdelegate + 0x88))
                    (this->m_hexdelegate,local_128,2,local_68);
        }
        uVar4 = QHexCursor::column(this->m_hexcursor);
        if ((uVar4 == h.d.size._4_4_) &&
           (bVar2 = QHexOptions::hasFlag(&this->m_options,0x80), bVar2)) {
          pQVar5 = (QPalette *)QWidget::palette();
          pQVar6 = QPalette::color(pQVar5,Highlight);
          QBrush::QBrush(local_168,(QColor *)pQVar6,SolidPattern);
          QTextFormat::setBackground((QTextFormat *)local_68,local_168);
          QBrush::~QBrush(local_168);
          pQVar5 = (QPalette *)QWidget::palette();
          pQVar6 = QPalette::color(pQVar5,HighlightedText);
          QBrush::QBrush(local_170,(QColor *)pQVar6,SolidPattern);
          QTextFormat::setForeground((QTextFormat *)local_68,local_170);
          QBrush::~QBrush(local_170);
        }
        QTextCursor::insertText((QString *)addresslabel.d.size,(QTextCharFormat *)local_128);
        qVar1 = addresslabel.d.size;
        QString::QString(&local_188," ");
        QTextCharFormat::QTextCharFormat(local_198);
        QTextCursor::insertText((QString *)qVar1,(QTextCharFormat *)&local_188);
        QTextCharFormat::~QTextCharFormat(local_198);
        QString::~QString(&local_188);
        drawHeader::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&drawHeader(QTextCursor&)::RESET_FORMAT,
                   &this->m_options,local_68);
        QString::~QString((QString *)local_128);
      }
    }
    else {
      if (this->m_hexdelegate != (QHexDelegate *)0x0) {
        (**(code **)(*(long *)this->m_hexdelegate + 0x88))(this->m_hexdelegate,local_c8,2,local_68);
      }
      qVar1 = addresslabel.d.size;
      qVar7 = hexColumnWidth(this);
      qVar8 = cellWidth(this);
      reduced((QString *)&asciilabel.d.size,(QString *)local_c8,(int)(qVar7 / qVar8 + -1.0));
      ::operator+(&local_1c8," ",(QString *)&asciilabel.d.size);
      ::operator+(&local_1b0,&local_1c8," ");
      QTextCursor::insertText((QString *)qVar1);
      QString::~QString(&local_1b0);
      QString::~QString(&local_1c8);
      QString::~QString((QString *)&asciilabel.d.size);
    }
    if (this->m_hexdelegate != (QHexDelegate *)0x0) {
      drawHeader::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&drawHeader(QTextCursor&)::RESET_FORMAT,&this->m_options
                 ,local_68);
    }
    QString::QString((QString *)local_1f8);
    if (this->m_hexdelegate != (QHexDelegate *)0x0) {
      (**(code **)(*(long *)this->m_hexdelegate + 0x70))(&local_210);
      QString::operator=((QString *)local_1f8,&local_210);
      QString::~QString(&local_210);
    }
    bVar2 = QString::isEmpty((QString *)local_1f8);
    if (bVar2) {
      QString::operator=((QString *)local_1f8,(QString *)&(this->m_options).asciilabel);
    }
    bVar2 = QString::isNull((QString *)local_1f8);
    qVar1 = addresslabel.d.size;
    if (bVar2) {
      QString::QString(&local_228," ");
      QTextCharFormat::QTextCharFormat(local_238);
      QTextCursor::insertText((QString *)qVar1,(QTextCharFormat *)&local_228);
      QTextCharFormat::~QTextCharFormat(local_238);
      QString::~QString(&local_228);
      for (a.d.size._4_4_ = 0; qVar1 = addresslabel.d.size,
          a.d.size._4_4_ < (this->m_options).linelength; a.d.size._4_4_ = a.d.size._4_4_ + 1) {
        QString::number((uint)&local_270,a.d.size._4_4_);
        QString::toUpper((QString *)local_258,&local_270);
        QString::~QString(&local_270);
        if (this->m_hexdelegate != (QHexDelegate *)0x0) {
          drawHeader::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&drawHeader(QTextCursor&)::RESET_FORMAT,
                     &this->m_options,local_68);
          (**(code **)(*(long *)this->m_hexdelegate + 0x88))
                    (this->m_hexdelegate,local_258,3,local_68);
        }
        uVar4 = QHexCursor::column(this->m_hexcursor);
        if ((uVar4 == a.d.size._4_4_) &&
           (bVar2 = QHexOptions::hasFlag(&this->m_options,0x80), bVar2)) {
          pQVar5 = (QPalette *)QWidget::palette();
          pQVar6 = QPalette::color(pQVar5,Highlight);
          QBrush::QBrush(local_278,(QColor *)pQVar6,SolidPattern);
          QTextFormat::setBackground((QTextFormat *)local_68,local_278);
          QBrush::~QBrush(local_278);
          pQVar5 = (QPalette *)QWidget::palette();
          pQVar6 = QPalette::color(pQVar5,HighlightedText);
          QBrush::QBrush(local_280,(QColor *)pQVar6,SolidPattern);
          QTextFormat::setForeground((QTextFormat *)local_68,local_280);
          QBrush::~QBrush(local_280);
        }
        QTextCursor::insertText((QString *)addresslabel.d.size,(QTextCharFormat *)local_258);
        drawHeader::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&drawHeader(QTextCursor&)::RESET_FORMAT,
                   &this->m_options,local_68);
        QString::~QString((QString *)local_258);
      }
      QString::QString(&local_298," ");
      QTextCharFormat::QTextCharFormat(local_2a8);
      QTextCursor::insertText((QString *)qVar1,(QTextCharFormat *)&local_298);
      QTextCharFormat::~QTextCharFormat(local_2a8);
      QString::~QString(&local_298);
    }
    else {
      if (this->m_hexdelegate != (QHexDelegate *)0x0) {
        (**(code **)(*(long *)this->m_hexdelegate + 0x88))(this->m_hexdelegate,local_1f8,3,local_68)
        ;
      }
      qVar1 = addresslabel.d.size;
      qVar7 = endColumnX(this);
      qVar8 = asciiColumnX(this);
      qVar9 = cellWidth(this);
      qVar10 = cellWidth(this);
      reduced(&local_2f0,(QString *)local_1f8,(int)(((qVar7 - qVar8) - qVar9) / qVar10 + -1.0));
      ::operator+(&local_2d8," ",&local_2f0);
      ::operator+(&local_2c0,&local_2d8," ");
      QTextCursor::insertText((QString *)qVar1);
      QString::~QString(&local_2c0);
      QString::~QString(&local_2d8);
      QString::~QString(&local_2f0);
    }
    QTextBlockFormat::QTextBlockFormat(local_300);
    bVar2 = QHexOptions::hasFlag(&this->m_options,8);
    if (bVar2) {
      pQVar5 = (QPalette *)QWidget::palette();
      pQVar6 = QPalette::color(pQVar5,Window);
      QBrush::QBrush(local_308,(QColor *)pQVar6,SolidPattern);
      QTextFormat::setBackground((QTextFormat *)local_300,local_308);
      QBrush::~QBrush(local_308);
    }
    if (this->m_hexdelegate != (QHexDelegate *)0x0) {
      (**(code **)(*(long *)this->m_hexdelegate + 0x80))(this->m_hexdelegate,local_300);
    }
    QTextCursor::setBlockFormat((QTextBlockFormat *)addresslabel.d.size);
    QTextCursor::insertBlock();
    QTextBlockFormat::~QTextBlockFormat(local_300);
    QString::~QString((QString *)local_1f8);
    QString::~QString((QString *)local_c8);
    QTextCharFormat::~QTextCharFormat(local_68);
    QString::~QString((QString *)local_30);
  }
  return;
}

Assistant:

void QHexView::drawHeader(QTextCursor& c) const {
    if(m_options.hasFlag(QHexFlags::NoHeader))
        return;

    static const auto RESET_FORMAT = [](const QHexOptions& options,
                                        QTextCharFormat& cf) {
        cf = {};
        cf.setForeground(options.headercolor);
    };

    QString addresslabel;
    if(m_hexdelegate)
        addresslabel = m_hexdelegate->addressHeader(this);
    if(addresslabel.isEmpty() && !m_options.addresslabel.isEmpty())
        addresslabel = m_options.addresslabel;

    QTextCharFormat cf;
    RESET_FORMAT(m_options, cf);
    if(m_hexdelegate)
        m_hexdelegate->renderHeaderPart(addresslabel, QHexArea::Address, cf,
                                        this);
    c.insertText(
        " " + QHexView::reduced(addresslabel, this->addressWidth()) + " ", cf);

    if(m_hexdelegate)
        RESET_FORMAT(m_options, cf);

    QString hexlabel;
    if(m_hexdelegate)
        hexlabel = m_hexdelegate->hexHeader(this);
    if(hexlabel.isEmpty())
        hexlabel = m_options.hexlabel;

    if(hexlabel.isNull()) {
        c.insertText(" ", {});

        for(auto i = 0u; i < m_options.linelength; i += m_options.grouplength) {
            QString h = QString::number(i, 16)
                            .rightJustified(m_options.grouplength * 2, '0')
                            .toUpper();

            if(m_hexdelegate) {
                RESET_FORMAT(m_options, cf);
                m_hexdelegate->renderHeaderPart(h, QHexArea::Hex, cf, this);
            }

            if(m_hexcursor->column() == static_cast<qint64>(i) &&
               m_options.hasFlag(QHexFlags::HighlightColumn)) {
                cf.setBackground(this->palette().color(QPalette::Highlight));
                cf.setForeground(
                    this->palette().color(QPalette::HighlightedText));
            }

            c.insertText(h, cf);
            c.insertText(" ", {});
            RESET_FORMAT(m_options, cf);
        }
    }
    else {
        if(m_hexdelegate)
            m_hexdelegate->renderHeaderPart(hexlabel, QHexArea::Hex, cf, this);
        c.insertText(
            " " +
            QHexView::reduced(
                hexlabel, (this->hexColumnWidth() / this->cellWidth()) - 1) +
            " ");
    }

    if(m_hexdelegate)
        RESET_FORMAT(m_options, cf);

    QString asciilabel;
    if(m_hexdelegate)
        asciilabel = m_hexdelegate->asciiHeader(this);
    if(asciilabel.isEmpty())
        asciilabel = m_options.asciilabel;

    if(asciilabel.isNull()) {
        c.insertText(" ", {});

        for(unsigned int i = 0; i < m_options.linelength; i++) {
            QString a = QString::number(i, 16).toUpper();

            if(m_hexdelegate) {
                RESET_FORMAT(m_options, cf);
                m_hexdelegate->renderHeaderPart(a, QHexArea::Ascii, cf, this);
            }

            if(m_hexcursor->column() == static_cast<qint64>(i) &&
               m_options.hasFlag(QHexFlags::HighlightColumn)) {
                cf.setBackground(this->palette().color(QPalette::Highlight));
                cf.setForeground(
                    this->palette().color(QPalette::HighlightedText));
            }

            c.insertText(a, cf);
            RESET_FORMAT(m_options, cf);
        }

        c.insertText(" ", {});
    }
    else {
        if(m_hexdelegate)
            m_hexdelegate->renderHeaderPart(asciilabel, QHexArea::Ascii, cf,
                                            this);
        c.insertText(" " +
                     QHexView::reduced(asciilabel, ((this->endColumnX() -
                                                     this->asciiColumnX() -
                                                     this->cellWidth()) /
                                                    this->cellWidth()) -
                                                       1) +
                     " ");
    }

    QTextBlockFormat bf;
    if(m_options.hasFlag(QHexFlags::StyledHeader))
        bf.setBackground(this->palette().color(QPalette::Window));
    if(m_hexdelegate)
        m_hexdelegate->renderHeader(bf, this);
    c.setBlockFormat(bf);
    c.insertBlock();
}